

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall
QTreeWidgetItemPrivate::updateHiddenStatus
          (QTreeWidgetItemPrivate *this,QTreeWidgetItem *item,bool inserting)

{
  QTreeWidgetItem *pQVar1;
  QTreeView *this_00;
  int row;
  QTreeModel *__s;
  iterator iVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QModelIndex local_90;
  QTreeWidgetItem *local_78;
  undefined1 *puStack_70;
  QTreeWidgetItem *local_68;
  QArrayData *local_58;
  QModelIndex *pQStack_50;
  long local_48;
  QTreeWidgetItemIterator **local_38;
  
  local_38 = *(QTreeWidgetItemIterator ***)(in_FS_OFFSET + 0x28);
  __s = QTreeWidgetItem::treeModel(item,(QTreeWidget *)0x0);
  if (__s != (QTreeModel *)0x0) {
    local_58 = (QArrayData *)0x0;
    pQStack_50 = (QModelIndex *)0x0;
    local_48 = 0;
    local_78 = item;
    QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
              ((QPodArrayOps<QTreeWidgetItem*> *)&local_58,0,&local_78);
    QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_58);
    if (local_48 != 0) {
      do {
        iVar2 = QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_58);
        pQVar1 = iVar2.i[-1];
        local_48 = local_48 + -1;
        if ((pQVar1->d->field_0x20 & 4) != 0) {
          local_68 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
          local_78 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
          QTreeModel::index((QTreeModel *)&local_78,(char *)__s,(int)pQVar1);
          this_00 = &item->view->super_QTreeView;
          row = (int)local_78;
          if (local_68 == (QTreeWidgetItem *)0x0) {
            local_90.r = -1;
            local_90.c = -1;
            local_90.i = 0;
            local_90.m.ptr = (QAbstractItemModel *)0x0;
          }
          else {
            (*local_68->_vptr_QTreeWidgetItem[0xd])(&local_90,local_68,(QTreeModel *)&local_78);
          }
          QTreeView::setRowHidden(this_00,row,&local_90,inserting);
        }
        if ((pQVar1->children).d.size != 0) {
          uVar3 = 0;
          do {
            local_78 = (pQVar1->children).d.ptr[uVar3];
            QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                      ((QPodArrayOps<QTreeWidgetItem*> *)&local_58,local_48,&local_78);
            QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_58);
            uVar3 = uVar3 + 1;
          } while (uVar3 < (ulong)(pQVar1->children).d.size);
        }
      } while (local_48 != 0);
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,8,0x10);
      }
    }
  }
  if (*(QTreeWidgetItemIterator ***)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetItemPrivate::updateHiddenStatus(QTreeWidgetItem *item, bool inserting)
{
    QTreeModel *model = item->treeModel();
    if (!model)
        return;
    QStack<QTreeWidgetItem *> parents;
    parents.push(item);
    while (!parents.isEmpty()) {
        QTreeWidgetItem *parent = parents.pop();
        if (parent->d->hidden) {
            const QModelIndex index = model->index(parent, 0);
            item->view->setRowHidden(index.row(), index.parent(), inserting);
        }
        for (int i = 0; i < parent->children.size(); ++i) {
            QTreeWidgetItem *child = parent->children.at(i);
            parents.push(child);
        }
    }
}